

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O3

int __thiscall NULLCFile::FileWrite(NULLCFile *this,NULLCArray arr,File *file)

{
  size_t sVar1;
  long lVar2;
  char *error;
  
  lVar2 = CONCAT44((int)((ulong)register0x00000010 >> 0x20),arr.len);
  if (lVar2 == 0) {
    error = "ERROR: null pointer access";
  }
  else {
    if (*(FILE **)(lVar2 + 4) != (FILE *)0x0) {
      if (this != (NULLCFile *)0x0) {
        sVar1 = fwrite(this,1,(ulong)arr.ptr & 0xffffffff,*(FILE **)(lVar2 + 4));
        return (int)sVar1;
      }
      return 0;
    }
    error = "Cannot write to a closed file.";
    file = (File *)0x0;
  }
  nullcThrowError(error,arr.ptr,lVar2,file);
  return 0;
}

Assistant:

int FileWrite(NULLCArray arr, File* file)
	{
		if(!file)
		{
			nullcThrowError("ERROR: null pointer access");
			return 0;
		}

		if(!file->handle)
		{
			nullcThrowError("Cannot write to a closed file.");
			return 0;
		}

		return arr.ptr ? int(fwrite(arr.ptr, 1, arr.len, file->handle)) : 0;
	}